

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

void __thiscall
Darts::Details::AutoPool<Darts::Details::DawgNode>::resize
          (AutoPool<Darts::Details::DawgNode> *this,size_t size)

{
  DawgNode *this_00;
  AutoPool<Darts::Details::DawgNode> *in_RSI;
  size_t in_RDI;
  size_t in_stack_00000038;
  AutoPool<Darts::Details::DawgNode> *in_stack_00000040;
  
  while (in_RSI < *(AutoPool<Darts::Details::DawgNode> **)(in_RDI + 8)) {
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + -1;
    operator[](in_RSI,in_RDI);
  }
  if (*(AutoPool<Darts::Details::DawgNode> **)(in_RDI + 0x10) < in_RSI) {
    resize_buf(in_stack_00000040,in_stack_00000038);
  }
  while (*(AutoPool<Darts::Details::DawgNode> **)(in_RDI + 8) < in_RSI) {
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 1;
    this_00 = operator[](in_RSI,in_RDI);
    DawgNode::DawgNode(this_00);
  }
  return;
}

Assistant:

void resize(std::size_t size) {
    while (size_ > size) {
      (*this)[--size_].~T();
    }
    if (size > capacity_) {
      resize_buf(size);
    }
    while (size_ < size) {
      new(&(*this)[size_++]) T;
    }
  }